

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_wString __thiscall ON_XMLNodePrivate::GetNameFromTag(ON_XMLNodePrivate *this,wchar_t *wszTag)

{
  uint uVar1;
  
  ON_wString::ON_wString((ON_wString *)this,wszTag);
  ON_wString::TrimLeft((ON_wString *)this,L"</ ");
  ON_wString::TrimRight((ON_wString *)this,L">/ ");
  uVar1 = ON_wString::Find((ON_wString *)this,L' ');
  if (-1 < (int)uVar1) {
    ON_wString::SetLength((ON_wString *)this,(ulong)uVar1);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_XMLNodePrivate::GetNameFromTag(const wchar_t* wszTag) // Static.
{
  ON_wString name = wszTag;
  name.TrimLeft(L"</ ");
  name.TrimRight(L">/ ");

  const int pos = name.Find(L' ');
  if (pos >= 0)
  {
    name.SetLength(pos);
  }

  return name;
}